

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# image.c
# Opt level: O1

void icetClearSparseImage(IceTSparseImage image)

{
  if (image.opaque_internals != (IceTVoid *)0x0) {
    *(int *)((long)image.opaque_internals + 0x1c) =
         *(int *)((long)image.opaque_internals + 0x10) *
         *(int *)((long)image.opaque_internals + 0xc);
    *(undefined4 *)((long)image.opaque_internals + 0x20) = 0;
    *(undefined4 *)((long)image.opaque_internals + 0x18) = 0x24;
  }
  return;
}

Assistant:

void icetClearSparseImage(IceTSparseImage image)
{
    IceTByte *data;

    ICET_TEST_SPARSE_IMAGE_HEADER(image);

    if (icetSparseImageIsNull(image)) { return; }

    /* Use IceTByte for byte-based pointer arithmetic. */
    data = ICET_IMAGE_DATA(image);
    INACTIVE_RUN_LENGTH(data) = icetSparseImageGetNumPixels(image);
    ACTIVE_RUN_LENGTH(data) = 0;

    icetSparseImageSetActualSize(image, data+RUN_LENGTH_SIZE);
}